

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrototypeChainCache.cpp
# Opt level: O2

void __thiscall
Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>::Register
          (ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_> *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_> **ppSVar4;
  
  if (this->cache == (PrototypeChainCache<Js::NoSpecialPropertyCache> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/PrototypeChainCache.cpp"
                                ,0x4f,"(this->cache != nullptr)","this->cache != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if (this->registration ==
      (ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_> **)0x0) {
    ppSVar4 = ThreadCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>::Register
                        (this->threadRegistry,this);
    this->registration = ppSVar4;
  }
  return;
}

Assistant:

void
ScriptCacheRegistry<T>::Register()
{
    Assert(this->cache != nullptr);
    if (this->registration == nullptr)
    {
        this->registration = this->threadRegistry->Register(this);
    }
}